

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixgbe.c
# Opt level: O0

mac_address ixgbe_get_mac_addr(ixy_device *ixy)

{
  uint32_t uVar1;
  uint32_t uVar2;
  long in_RDI;
  uint32_t rar_high;
  uint32_t rar_low;
  ixy_device *__mptr;
  ixgbe_device *dev;
  mac_address mac;
  undefined4 local_34;
  
  uVar1 = get_reg32(*(uint8_t **)(in_RDI + 0x70),0x5400);
  uVar2 = get_reg32(*(uint8_t **)(in_RDI + 0x70),0x5404);
  local_34 = uVar2 & 0xffff;
  return (uint8_t  [6])((uint6)uVar1 | (uint6)local_34 << 0x20);
}

Assistant:

struct mac_address ixgbe_get_mac_addr(const struct ixy_device* ixy) {
	struct mac_address mac;
	struct ixgbe_device* dev = IXY_TO_IXGBE(ixy);

	uint32_t rar_low = get_reg32(dev->addr, IXGBE_RAL(0));
	uint32_t rar_high = get_reg32(dev->addr, IXGBE_RAH(0));

	mac.addr[0] = rar_low;
	mac.addr[1] = rar_low >> 8;
	mac.addr[2] = rar_low >> 16;
	mac.addr[3] = rar_low >> 24;
	mac.addr[4] = rar_high;
	mac.addr[5] = rar_high >> 8;

	return mac;
}